

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

void vkb::detail::combine_features(VkPhysicalDeviceFeatures *dest,VkPhysicalDeviceFeatures src)

{
  dest->robustBufferAccess = (uint)(src.robustBufferAccess != 0 || dest->robustBufferAccess != 0);
  dest->fullDrawIndexUint32 = (uint)(src.fullDrawIndexUint32 != 0 || dest->fullDrawIndexUint32 != 0)
  ;
  dest->imageCubeArray = (uint)(src.imageCubeArray != 0 || dest->imageCubeArray != 0);
  dest->independentBlend = (uint)(src.independentBlend != 0 || dest->independentBlend != 0);
  dest->geometryShader = (uint)(src.geometryShader != 0 || dest->geometryShader != 0);
  dest->tessellationShader = (uint)(src.tessellationShader != 0 || dest->tessellationShader != 0);
  dest->sampleRateShading = (uint)(src.sampleRateShading != 0 || dest->sampleRateShading != 0);
  dest->dualSrcBlend = (uint)(src.dualSrcBlend != 0 || dest->dualSrcBlend != 0);
  dest->logicOp = (uint)(src.logicOp != 0 || dest->logicOp != 0);
  dest->multiDrawIndirect = (uint)(src.multiDrawIndirect != 0 || dest->multiDrawIndirect != 0);
  dest->drawIndirectFirstInstance =
       (uint)(src.drawIndirectFirstInstance != 0 || dest->drawIndirectFirstInstance != 0);
  dest->depthClamp = (uint)(src.depthClamp != 0 || dest->depthClamp != 0);
  dest->depthBiasClamp = (uint)(src.depthBiasClamp != 0 || dest->depthBiasClamp != 0);
  dest->fillModeNonSolid = (uint)(src.fillModeNonSolid != 0 || dest->fillModeNonSolid != 0);
  dest->depthBounds = (uint)(src.depthBounds != 0 || dest->depthBounds != 0);
  dest->wideLines = (uint)(src.wideLines != 0 || dest->wideLines != 0);
  dest->largePoints = (uint)(src.largePoints != 0 || dest->largePoints != 0);
  dest->alphaToOne = (uint)(src.alphaToOne != 0 || dest->alphaToOne != 0);
  dest->multiViewport = (uint)(src.multiViewport != 0 || dest->multiViewport != 0);
  dest->samplerAnisotropy = (uint)(src.samplerAnisotropy != 0 || dest->samplerAnisotropy != 0);
  dest->textureCompressionETC2 =
       (uint)(src.textureCompressionETC2 != 0 || dest->textureCompressionETC2 != 0);
  dest->textureCompressionASTC_LDR =
       (uint)(src.textureCompressionASTC_LDR != 0 || dest->textureCompressionASTC_LDR != 0);
  dest->textureCompressionBC =
       (uint)(src.textureCompressionBC != 0 || dest->textureCompressionBC != 0);
  dest->occlusionQueryPrecise =
       (uint)(src.occlusionQueryPrecise != 0 || dest->occlusionQueryPrecise != 0);
  dest->pipelineStatisticsQuery =
       (uint)(src.pipelineStatisticsQuery != 0 || dest->pipelineStatisticsQuery != 0);
  dest->vertexPipelineStoresAndAtomics =
       (uint)(src.vertexPipelineStoresAndAtomics != 0 || dest->vertexPipelineStoresAndAtomics != 0);
  dest->fragmentStoresAndAtomics =
       (uint)(src.fragmentStoresAndAtomics != 0 || dest->fragmentStoresAndAtomics != 0);
  dest->shaderTessellationAndGeometryPointSize =
       (uint)(src.shaderTessellationAndGeometryPointSize != 0 ||
             dest->shaderTessellationAndGeometryPointSize != 0);
  dest->shaderImageGatherExtended =
       (uint)(src.shaderImageGatherExtended != 0 || dest->shaderImageGatherExtended != 0);
  dest->shaderStorageImageExtendedFormats =
       (uint)(src.shaderStorageImageExtendedFormats != 0 ||
             dest->shaderStorageImageExtendedFormats != 0);
  dest->shaderStorageImageMultisample =
       (uint)(src.shaderStorageImageMultisample != 0 || dest->shaderStorageImageMultisample != 0);
  dest->shaderStorageImageReadWithoutFormat =
       (uint)(src.shaderStorageImageReadWithoutFormat != 0 ||
             dest->shaderStorageImageReadWithoutFormat != 0);
  dest->shaderStorageImageWriteWithoutFormat =
       (uint)(src.shaderStorageImageWriteWithoutFormat != 0 ||
             dest->shaderStorageImageWriteWithoutFormat != 0);
  dest->shaderUniformBufferArrayDynamicIndexing =
       (uint)(src.shaderUniformBufferArrayDynamicIndexing != 0 ||
             dest->shaderUniformBufferArrayDynamicIndexing != 0);
  dest->shaderSampledImageArrayDynamicIndexing =
       (uint)(src.shaderSampledImageArrayDynamicIndexing != 0 ||
             dest->shaderSampledImageArrayDynamicIndexing != 0);
  dest->shaderStorageBufferArrayDynamicIndexing =
       (uint)(src.shaderStorageBufferArrayDynamicIndexing != 0 ||
             dest->shaderStorageBufferArrayDynamicIndexing != 0);
  dest->shaderStorageImageArrayDynamicIndexing =
       (uint)(src.shaderStorageImageArrayDynamicIndexing != 0 ||
             dest->shaderStorageImageArrayDynamicIndexing != 0);
  dest->shaderClipDistance = (uint)(src.shaderClipDistance != 0 || dest->shaderClipDistance != 0);
  dest->shaderCullDistance = (uint)(src.shaderCullDistance != 0 || dest->shaderCullDistance != 0);
  dest->shaderFloat64 = (uint)(src.shaderFloat64 != 0 || dest->shaderFloat64 != 0);
  dest->shaderInt64 = (uint)(src.shaderInt64 != 0 || dest->shaderInt64 != 0);
  dest->shaderInt16 = (uint)(src.shaderInt16 != 0 || dest->shaderInt16 != 0);
  dest->shaderResourceResidency =
       (uint)(src.shaderResourceResidency != 0 || dest->shaderResourceResidency != 0);
  dest->shaderResourceMinLod =
       (uint)(src.shaderResourceMinLod != 0 || dest->shaderResourceMinLod != 0);
  dest->sparseBinding = (uint)(src.sparseBinding != 0 || dest->sparseBinding != 0);
  dest->sparseResidencyBuffer =
       (uint)(src.sparseResidencyBuffer != 0 || dest->sparseResidencyBuffer != 0);
  dest->sparseResidencyImage2D =
       (uint)(src.sparseResidencyImage2D != 0 || dest->sparseResidencyImage2D != 0);
  dest->sparseResidencyImage3D =
       (uint)(src.sparseResidencyImage3D != 0 || dest->sparseResidencyImage3D != 0);
  dest->sparseResidency2Samples =
       (uint)(src.sparseResidency2Samples != 0 || dest->sparseResidency2Samples != 0);
  dest->sparseResidency4Samples =
       (uint)(src.sparseResidency4Samples != 0 || dest->sparseResidency4Samples != 0);
  dest->sparseResidency8Samples =
       (uint)(src.sparseResidency8Samples != 0 || dest->sparseResidency8Samples != 0);
  dest->sparseResidency16Samples =
       (uint)(src.sparseResidency16Samples != 0 || dest->sparseResidency16Samples != 0);
  dest->sparseResidencyAliased =
       (uint)(src.sparseResidencyAliased != 0 || dest->sparseResidencyAliased != 0);
  dest->variableMultisampleRate =
       (uint)(src.variableMultisampleRate != 0 || dest->variableMultisampleRate != 0);
  dest->inheritedQueries = (uint)(src.inheritedQueries != 0 || dest->inheritedQueries != 0);
  return;
}

Assistant:

void combine_features(VkPhysicalDeviceFeatures& dest, VkPhysicalDeviceFeatures src){
    dest.robustBufferAccess = dest.robustBufferAccess || src.robustBufferAccess;
	dest.fullDrawIndexUint32 = dest.fullDrawIndexUint32 || src.fullDrawIndexUint32;
	dest.imageCubeArray = dest.imageCubeArray || src.imageCubeArray;
	dest.independentBlend = dest.independentBlend || src.independentBlend;
	dest.geometryShader = dest.geometryShader || src.geometryShader;
	dest.tessellationShader = dest.tessellationShader || src.tessellationShader;
	dest.sampleRateShading = dest.sampleRateShading || src.sampleRateShading;
	dest.dualSrcBlend = dest.dualSrcBlend || src.dualSrcBlend;
	dest.logicOp = dest.logicOp || src.logicOp;
	dest.multiDrawIndirect = dest.multiDrawIndirect || src.multiDrawIndirect;
	dest.drawIndirectFirstInstance = dest.drawIndirectFirstInstance || src.drawIndirectFirstInstance;
	dest.depthClamp = dest.depthClamp || src.depthClamp;
	dest.depthBiasClamp = dest.depthBiasClamp || src.depthBiasClamp;
	dest.fillModeNonSolid = dest.fillModeNonSolid || src.fillModeNonSolid;
	dest.depthBounds = dest.depthBounds || src.depthBounds;
	dest.wideLines = dest.wideLines || src.wideLines;
	dest.largePoints = dest.largePoints || src.largePoints;
	dest.alphaToOne = dest.alphaToOne || src.alphaToOne;
	dest.multiViewport = dest.multiViewport || src.multiViewport;
	dest.samplerAnisotropy = dest.samplerAnisotropy || src.samplerAnisotropy;
	dest.textureCompressionETC2 = dest.textureCompressionETC2 || src.textureCompressionETC2;
	dest.textureCompressionASTC_LDR = dest.textureCompressionASTC_LDR || src.textureCompressionASTC_LDR;
	dest.textureCompressionBC = dest.textureCompressionBC || src.textureCompressionBC;
	dest.occlusionQueryPrecise = dest.occlusionQueryPrecise || src.occlusionQueryPrecise;
	dest.pipelineStatisticsQuery = dest.pipelineStatisticsQuery || src.pipelineStatisticsQuery;
	dest.vertexPipelineStoresAndAtomics = dest.vertexPipelineStoresAndAtomics || src.vertexPipelineStoresAndAtomics;
	dest.fragmentStoresAndAtomics = dest.fragmentStoresAndAtomics || src.fragmentStoresAndAtomics;
	dest.shaderTessellationAndGeometryPointSize = dest.shaderTessellationAndGeometryPointSize || src.shaderTessellationAndGeometryPointSize;
	dest.shaderImageGatherExtended = dest.shaderImageGatherExtended || src.shaderImageGatherExtended;
	dest.shaderStorageImageExtendedFormats = dest.shaderStorageImageExtendedFormats || src.shaderStorageImageExtendedFormats;
	dest.shaderStorageImageMultisample = dest.shaderStorageImageMultisample || src.shaderStorageImageMultisample;
	dest.shaderStorageImageReadWithoutFormat = dest.shaderStorageImageReadWithoutFormat || src.shaderStorageImageReadWithoutFormat;
	dest.shaderStorageImageWriteWithoutFormat = dest.shaderStorageImageWriteWithoutFormat || src.shaderStorageImageWriteWithoutFormat;
	dest.shaderUniformBufferArrayDynamicIndexing = dest.shaderUniformBufferArrayDynamicIndexing || src.shaderUniformBufferArrayDynamicIndexing;
	dest.shaderSampledImageArrayDynamicIndexing = dest.shaderSampledImageArrayDynamicIndexing || src.shaderSampledImageArrayDynamicIndexing;
	dest.shaderStorageBufferArrayDynamicIndexing = dest.shaderStorageBufferArrayDynamicIndexing || src.shaderStorageBufferArrayDynamicIndexing;
	dest.shaderStorageImageArrayDynamicIndexing = dest.shaderStorageImageArrayDynamicIndexing || src.shaderStorageImageArrayDynamicIndexing;
	dest.shaderClipDistance = dest.shaderClipDistance || src.shaderClipDistance;
	dest.shaderCullDistance = dest.shaderCullDistance || src.shaderCullDistance;
	dest.shaderFloat64 = dest.shaderFloat64 || src.shaderFloat64;
	dest.shaderInt64 = dest.shaderInt64 || src.shaderInt64;
	dest.shaderInt16 = dest.shaderInt16 || src.shaderInt16;
	dest.shaderResourceResidency = dest.shaderResourceResidency || src.shaderResourceResidency;
	dest.shaderResourceMinLod = dest.shaderResourceMinLod || src.shaderResourceMinLod;
	dest.sparseBinding = dest.sparseBinding || src.sparseBinding;
	dest.sparseResidencyBuffer = dest.sparseResidencyBuffer || src.sparseResidencyBuffer;
	dest.sparseResidencyImage2D = dest.sparseResidencyImage2D || src.sparseResidencyImage2D;
	dest.sparseResidencyImage3D = dest.sparseResidencyImage3D || src.sparseResidencyImage3D;
	dest.sparseResidency2Samples = dest.sparseResidency2Samples || src.sparseResidency2Samples;
	dest.sparseResidency4Samples = dest.sparseResidency4Samples || src.sparseResidency4Samples;
	dest.sparseResidency8Samples = dest.sparseResidency8Samples || src.sparseResidency8Samples;
	dest.sparseResidency16Samples = dest.sparseResidency16Samples || src.sparseResidency16Samples;
	dest.sparseResidencyAliased = dest.sparseResidencyAliased || src.sparseResidencyAliased;
	dest.variableMultisampleRate = dest.variableMultisampleRate || src.variableMultisampleRate;
	dest.inheritedQueries = dest.inheritedQueries || src.inheritedQueries;
}